

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O0

void __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>::functor
          (functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>
           *this,float Ja,float Jb,float Jc,fvar<float,_2UL> beta)

{
  fvar<float,_2UL> *in_RDI;
  type tVar1;
  fvar<float,_2UL> fVar2;
  promote<fvar<float,_2UL>,_fvar<float,_2UL>_> pVar3;
  float pi;
  root_type *in_stack_fffffffffffffc88;
  float *ca;
  fvar<float,_2UL> *this_00;
  fvar<float,_2UL> *in_stack_fffffffffffffc98;
  fvar<float,_2UL> *cr;
  float *ca_00;
  float *cr_00;
  fvar<float,_2UL> *in_stack_fffffffffffffcc0;
  float local_338;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  fvar<float,_2UL> *in_stack_fffffffffffffce0;
  undefined8 local_170;
  float local_168;
  undefined8 local_108;
  float local_100;
  undefined8 local_a0;
  float local_98;
  fvar<float,_2UL> local_34 [3];
  fvar<float,_2UL> local_10;
  
  ca_00 = (in_RDI->v)._M_elems + 1;
  cr_00 = in_RDI[2].v._M_elems + 1;
  tVar1 = boost::math::constants::pi<float>();
  (in_RDI->v)._M_elems[0] = 1.0 / (tVar1 * 8.0 * tVar1);
  this_00 = &local_10;
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,in_stack_fffffffffffffc98);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
            (this_00,in_stack_fffffffffffffc88);
  fVar2 = boost::math::differentiation::autodiff_v1::detail::sinh<float,2ul>
                    ((fvar<float,_2UL> *)cr_00);
  local_98 = fVar2.v._M_elems[2];
  local_a0 = fVar2.v._M_elems._0_8_;
  in_RDI[1].v._M_elems[0] = local_98;
  *(undefined8 *)((in_RDI->v)._M_elems + 1) = local_a0;
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,in_stack_fffffffffffffc98);
  ca = local_34[0].v._M_elems + 1;
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  fVar2 = boost::math::differentiation::autodiff_v1::detail::sinh<float,2ul>
                    ((fvar<float,_2UL> *)cr_00);
  local_100 = fVar2.v._M_elems[2];
  local_108 = fVar2.v._M_elems._0_8_;
  in_RDI[2].v._M_elems[0] = local_100;
  *(undefined8 *)(in_RDI[1].v._M_elems + 1) = local_108;
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,in_stack_fffffffffffffc98);
  cr = local_34;
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  fVar2 = boost::math::differentiation::autodiff_v1::detail::sinh<float,2ul>
                    ((fvar<float,_2UL> *)cr_00);
  local_168 = fVar2.v._M_elems[2];
  local_170 = fVar2.v._M_elems._0_8_;
  in_RDI[3].v._M_elems[0] = local_168;
  *(undefined8 *)(in_RDI[2].v._M_elems + 1) = local_170;
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,cr);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  boost::math::differentiation::autodiff_v1::detail::cosh<float,2ul>((fvar<float,_2UL> *)cr_00);
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,cr);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  boost::math::differentiation::autodiff_v1::detail::cosh<float,2ul>((fvar<float,_2UL> *)cr_00);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator*
            (in_stack_fffffffffffffce0,
             (fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  boost::math::differentiation::autodiff_v1::detail::operator*(ca_00,cr);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  boost::math::differentiation::autodiff_v1::detail::cosh<float,2ul>((fvar<float,_2UL> *)cr_00);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator*
            (in_stack_fffffffffffffce0,
             (fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  pVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator*
                    (in_stack_fffffffffffffce0,
                     (fvar<float,_2UL> *)
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator*
            (pVar3.v._M_elems._0_8_,
             (fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  pVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator+
                    (in_stack_fffffffffffffcc0,in_RDI);
  local_338 = pVar3.v._M_elems[2];
  *(long *)(in_RDI[3].v._M_elems + 1) = pVar3.v._M_elems._0_8_;
  in_RDI[4].v._M_elems[0] = local_338;
  return;
}

Assistant:

functor(T Ja, T Jb, T Jc, FVAR beta) {
    using std::cosh;
    using std::sinh;
    T pi = boost::math::constants::pi<T>();
    c_ = 1 / (8 * pi * pi);
    sh2a_ = sinh(2 * beta * Ja);
    sh2b_ = sinh(2 * beta * Jb);
    sh2c_ = sinh(2 * beta * Jc);
    cshabc_ = cosh(2 * beta * Ja) * cosh(2 * beta * Jb) * cosh(2 * beta * Jc) +
              sh2a_ * sh2b_ * sh2c_;
  }